

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

int notRecursiveHugeTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_0000000c;
  
  nb_tests = nb_tests + 1;
  lVar2 = xmlReaderForFile("huge:test",0,6,CONCAT44(in_register_0000000c,options));
  if (lVar2 == 0) {
    fwrite("Failed to open huge:test\n",0x19,1,_stderr);
    iVar1 = 1;
  }
  else {
    do {
      iVar1 = xmlTextReaderRead(lVar2);
    } while (iVar1 == 1);
    if (iVar1 != 0) {
      fwrite("Failed to parser huge:test with entities\n",0x29,1,_stderr);
      iVar1 = 1;
    }
    xmlFreeTextReader(lVar2);
  }
  return iVar1;
}

Assistant:

static int
notRecursiveHugeTest(const char *filename ATTRIBUTE_UNUSED,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlTextReaderPtr reader;
    int res = 0;
    int ret;

    nb_tests++;

    reader = xmlReaderForFile("huge:test" , NULL,
                              XML_PARSE_NOENT | XML_PARSE_DTDLOAD);
    if (reader == NULL) {
        fprintf(stderr, "Failed to open huge:test\n");
	return(1);
    }
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        fprintf(stderr, "Failed to parser huge:test with entities\n");
	res = 1;
    }
    xmlFreeTextReader(reader);

    return(res);
}